

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

pizza_cutter * parse_input_file(pizza_cutter *__return_storage_ptr__,string *file_name)

{
  pizza_cutter *ppVar1;
  char cVar2;
  istream *piVar3;
  char *pcVar4;
  int iVar5;
  int iVar6;
  int cols;
  int rows;
  int max_total;
  int min_each;
  pizza_row_t row;
  pizza_t pizza;
  ifstream ifs;
  int local_290;
  int local_28c;
  int local_288;
  int local_284;
  pizza_cell local_280;
  vector<pizza_cell,_std::allocator<pizza_cell>_> local_278;
  vector<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
  local_258;
  pizza_cutter *local_240;
  istream local_238 [520];
  
  std::ifstream::ifstream(local_238,(string *)file_name,_S_in);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    local_240 = __return_storage_ptr__;
    piVar3 = (istream *)std::istream::operator>>(local_238,&local_28c);
    piVar3 = (istream *)std::istream::operator>>(piVar3,&local_290);
    piVar3 = (istream *)std::istream::operator>>(piVar3,&local_284);
    std::istream::operator>>(piVar3,&local_288);
    std::istream::get();
    local_258.
    super__Vector_base<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_258.
    super__Vector_base<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_258.
    super__Vector_base<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (0 < local_28c) {
      iVar6 = 0;
      do {
        local_278.super__Vector_base<pizza_cell,_std::allocator<pizza_cell>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_278.super__Vector_base<pizza_cell,_std::allocator<pizza_cell>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_278.super__Vector_base<pizza_cell,_std::allocator<pizza_cell>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<pizza_cell,_std::allocator<pizza_cell>_>::reserve(&local_278,(long)local_290);
        if (0 < local_290) {
          iVar5 = 0;
          do {
            local_280.ingr = std::istream::get();
            local_280.owner = -1;
            std::vector<pizza_cell,_std::allocator<pizza_cell>_>::emplace_back<pizza_cell>
                      (&local_278,&local_280);
            iVar5 = iVar5 + 1;
          } while (iVar5 < local_290);
        }
        std::
        vector<std::vector<pizza_cell,std::allocator<pizza_cell>>,std::allocator<std::vector<pizza_cell,std::allocator<pizza_cell>>>>
        ::emplace_back<std::vector<pizza_cell,std::allocator<pizza_cell>>>
                  ((vector<std::vector<pizza_cell,std::allocator<pizza_cell>>,std::allocator<std::vector<pizza_cell,std::allocator<pizza_cell>>>>
                    *)&local_258,&local_278);
        std::istream::get();
        if (local_278.super__Vector_base<pizza_cell,_std::allocator<pizza_cell>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_278.super__Vector_base<pizza_cell,_std::allocator<pizza_cell>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_278.
                                super__Vector_base<pizza_cell,_std::allocator<pizza_cell>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_278.
                                super__Vector_base<pizza_cell,_std::allocator<pizza_cell>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        iVar6 = iVar6 + 1;
      } while (iVar6 < local_28c);
    }
    ppVar1 = local_240;
    local_240->max_total_ = local_288;
    local_240->min_each_ = local_284;
    (local_240->pizza_).
    super__Vector_base<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_258.
         super__Vector_base<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (local_240->pizza_).
    super__Vector_base<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_258.
         super__Vector_base<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (local_240->pizza_).
    super__Vector_base<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_258.
         super__Vector_base<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_258.
    super__Vector_base<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_258.
    super__Vector_base<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_258.
    super__Vector_base<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_240->slices_).super__Vector_base<pizza_slice,_std::allocator<pizza_slice>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_240->slices_).super__Vector_base<pizza_slice,_std::allocator<pizza_slice>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (local_240->slices_).super__Vector_base<pizza_slice,_std::allocator<pizza_slice>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
    ::~vector(&local_258);
    std::ifstream::~ifstream(local_238);
    return ppVar1;
  }
  pcVar4 = (char *)__cxa_allocate_exception(0x20);
  local_258.
  super__Vector_base<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)std::iostream_category();
  local_258.
  super__Vector_base<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_258.
                         super__Vector_base<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,1);
  std::ios_base::failure[abi:cxx11]::failure(pcVar4,(error_code *)"Cannot open the input file.");
  __cxa_throw(pcVar4,&std::ios_base::failure[abi:cxx11]::typeinfo,
              std::ios_base::failure[abi:cxx11]::~failure);
}

Assistant:

pizza_cutter parse_input_file(const std::string& file_name) {
    std::ifstream ifs(file_name);

    if (!ifs.is_open()) {
        throw std::ios_base::failure("Cannot open the input file.");
    }

    int rows, cols, min_each, max_total;
    ifs >> rows >> cols >> min_each >> max_total;
    ifs.get();

    pizza_t pizza;
    for (int i = 0; i < rows; ++i) {
        pizza_row_t row;
        row.reserve(cols);

        for (int j = 0; j < cols; ++j) {
            char val = ifs.get();
            row.push_back(pizza_cell{val});
        }

        pizza.push_back(std::move(row));
        ifs.get();
    }

    return pizza_cutter(min_each, max_total, std::move(pizza));
}